

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRigidBody.cpp
# Opt level: O1

void __thiscall btRigidBody::applyDamping(btRigidBody *this,btScalar timeStep)

{
  float fVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar3 = powf(1.0 - this->m_linearDamping,timeStep);
  uVar2 = *(undefined8 *)(this->m_linearVelocity).m_floats;
  *(ulong *)(this->m_linearVelocity).m_floats =
       CONCAT44(fVar3 * (float)((ulong)uVar2 >> 0x20),fVar3 * (float)uVar2);
  (this->m_linearVelocity).m_floats[2] = fVar3 * (this->m_linearVelocity).m_floats[2];
  fVar3 = powf(1.0 - this->m_angularDamping,timeStep);
  uVar2 = *(undefined8 *)(this->m_angularVelocity).m_floats;
  fVar4 = fVar3 * (float)uVar2;
  fVar5 = fVar3 * (float)((ulong)uVar2 >> 0x20);
  *(ulong *)(this->m_angularVelocity).m_floats = CONCAT44(fVar5,fVar4);
  fVar3 = fVar3 * (this->m_angularVelocity).m_floats[2];
  (this->m_angularVelocity).m_floats[2] = fVar3;
  if (this->m_additionalDamping == true) {
    if (fVar3 * fVar3 + fVar4 * fVar4 + fVar5 * fVar5 < this->m_additionalAngularDampingThresholdSqr
       ) {
      uVar2 = *(undefined8 *)(this->m_linearVelocity).m_floats;
      fVar6 = (float)uVar2;
      fVar7 = (float)((ulong)uVar2 >> 0x20);
      fVar8 = (this->m_linearVelocity).m_floats[2];
      if (fVar8 * fVar8 + fVar6 * fVar6 + fVar7 * fVar7 <
          this->m_additionalLinearDampingThresholdSqr) {
        fVar1 = this->m_additionalDampingFactor;
        *(ulong *)(this->m_angularVelocity).m_floats = CONCAT44(fVar5 * fVar1,fVar4 * fVar1);
        (this->m_angularVelocity).m_floats[2] = fVar3 * fVar1;
        *(ulong *)(this->m_linearVelocity).m_floats = CONCAT44(fVar7 * fVar1,fVar6 * fVar1);
        (this->m_linearVelocity).m_floats[2] = fVar8 * fVar1;
      }
    }
    fVar3 = (this->m_linearVelocity).m_floats[0];
    fVar4 = (this->m_linearVelocity).m_floats[1];
    fVar5 = (this->m_linearVelocity).m_floats[2];
    fVar3 = fVar5 * fVar5 + fVar3 * fVar3 + fVar4 * fVar4;
    if (fVar3 < 0.0) {
      fVar3 = sqrtf(fVar3);
    }
    else {
      fVar3 = SQRT(fVar3);
    }
    if (fVar3 < this->m_linearDamping) {
      if (fVar3 <= 0.005) {
        (this->m_linearVelocity).m_floats[0] = 0.0;
        (this->m_linearVelocity).m_floats[1] = 0.0;
        (this->m_linearVelocity).m_floats[2] = 0.0;
        (this->m_linearVelocity).m_floats[3] = 0.0;
      }
      else {
        uVar2 = *(undefined8 *)(this->m_linearVelocity).m_floats;
        fVar5 = (float)uVar2;
        fVar8 = (float)((ulong)uVar2 >> 0x20);
        fVar3 = (this->m_linearVelocity).m_floats[2];
        fVar4 = fVar3 * fVar3 + fVar5 * fVar5 + fVar8 * fVar8;
        if (fVar4 < 0.0) {
          fVar4 = sqrtf(fVar4);
        }
        else {
          fVar4 = SQRT(fVar4);
        }
        fVar4 = 1.0 / fVar4;
        uVar2 = *(undefined8 *)(this->m_linearVelocity).m_floats;
        *(ulong *)(this->m_linearVelocity).m_floats =
             CONCAT44((float)((ulong)uVar2 >> 0x20) + fVar8 * fVar4 * -0.005,
                      (float)uVar2 + fVar5 * fVar4 * -0.005);
        (this->m_linearVelocity).m_floats[2] =
             fVar3 * fVar4 * -0.005 + (this->m_linearVelocity).m_floats[2];
      }
    }
    fVar3 = (this->m_angularVelocity).m_floats[0];
    fVar4 = (this->m_angularVelocity).m_floats[1];
    fVar5 = (this->m_angularVelocity).m_floats[2];
    fVar3 = fVar5 * fVar5 + fVar3 * fVar3 + fVar4 * fVar4;
    if (fVar3 < 0.0) {
      fVar3 = sqrtf(fVar3);
    }
    else {
      fVar3 = SQRT(fVar3);
    }
    if (fVar3 < this->m_angularDamping) {
      if (fVar3 <= 0.005) {
        (this->m_angularVelocity).m_floats[0] = 0.0;
        (this->m_angularVelocity).m_floats[1] = 0.0;
        (this->m_angularVelocity).m_floats[2] = 0.0;
        (this->m_angularVelocity).m_floats[3] = 0.0;
      }
      else {
        uVar2 = *(undefined8 *)(this->m_angularVelocity).m_floats;
        fVar5 = (float)uVar2;
        fVar8 = (float)((ulong)uVar2 >> 0x20);
        fVar3 = (this->m_angularVelocity).m_floats[2];
        fVar4 = fVar3 * fVar3 + fVar5 * fVar5 + fVar8 * fVar8;
        if (fVar4 < 0.0) {
          fVar4 = sqrtf(fVar4);
        }
        else {
          fVar4 = SQRT(fVar4);
        }
        fVar4 = 1.0 / fVar4;
        uVar2 = *(undefined8 *)(this->m_angularVelocity).m_floats;
        *(ulong *)(this->m_angularVelocity).m_floats =
             CONCAT44((float)((ulong)uVar2 >> 0x20) + fVar8 * fVar4 * -0.005,
                      (float)uVar2 + fVar5 * fVar4 * -0.005);
        (this->m_angularVelocity).m_floats[2] =
             fVar3 * fVar4 * -0.005 + (this->m_angularVelocity).m_floats[2];
      }
    }
  }
  return;
}

Assistant:

void			btRigidBody::applyDamping(btScalar timeStep)
{
	//On new damping: see discussion/issue report here: http://code.google.com/p/bullet/issues/detail?id=74
	//todo: do some performance comparisons (but other parts of the engine are probably bottleneck anyway

//#define USE_OLD_DAMPING_METHOD 1
#ifdef USE_OLD_DAMPING_METHOD
	m_linearVelocity *= GEN_clamped((btScalar(1.) - timeStep * m_linearDamping), (btScalar)btScalar(0.0), (btScalar)btScalar(1.0));
	m_angularVelocity *= GEN_clamped((btScalar(1.) - timeStep * m_angularDamping), (btScalar)btScalar(0.0), (btScalar)btScalar(1.0));
#else
	m_linearVelocity *= btPow(btScalar(1)-m_linearDamping, timeStep);
	m_angularVelocity *= btPow(btScalar(1)-m_angularDamping, timeStep);
#endif

	if (m_additionalDamping)
	{
		//Additional damping can help avoiding lowpass jitter motion, help stability for ragdolls etc.
		//Such damping is undesirable, so once the overall simulation quality of the rigid body dynamics system has improved, this should become obsolete
		if ((m_angularVelocity.length2() < m_additionalAngularDampingThresholdSqr) &&
			(m_linearVelocity.length2() < m_additionalLinearDampingThresholdSqr))
		{
			m_angularVelocity *= m_additionalDampingFactor;
			m_linearVelocity *= m_additionalDampingFactor;
		}
	

		btScalar speed = m_linearVelocity.length();
		if (speed < m_linearDamping)
		{
			btScalar dampVel = btScalar(0.005);
			if (speed > dampVel)
			{
				btVector3 dir = m_linearVelocity.normalized();
				m_linearVelocity -=  dir * dampVel;
			} else
			{
				m_linearVelocity.setValue(btScalar(0.),btScalar(0.),btScalar(0.));
			}
		}

		btScalar angSpeed = m_angularVelocity.length();
		if (angSpeed < m_angularDamping)
		{
			btScalar angDampVel = btScalar(0.005);
			if (angSpeed > angDampVel)
			{
				btVector3 dir = m_angularVelocity.normalized();
				m_angularVelocity -=  dir * angDampVel;
			} else
			{
				m_angularVelocity.setValue(btScalar(0.),btScalar(0.),btScalar(0.));
			}
		}
	}
}